

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<Lib::ArrayMapEntry<unsigned_int>_>::DArray
          (DArray<Lib::ArrayMapEntry<unsigned_int>_> *this,size_t size)

{
  void *length;
  ArrayMapEntry<unsigned_int> *pAVar1;
  void *in_RSI;
  long *in_RDI;
  void *mem;
  
  *in_RDI = (long)in_RSI;
  in_RDI[1] = (long)in_RSI;
  if (in_RSI == (void *)0x0) {
    in_RDI[2] = 0;
  }
  else {
    length = Lib::alloc((size_t)in_RDI);
    pAVar1 = array_new<Lib::ArrayMapEntry<unsigned_int>>(in_RSI,(size_t)length);
    in_RDI[2] = (long)pAVar1;
  }
  return;
}

Assistant:

inline
  DArray (size_t size=0)
    : _size(size), _capacity(size)
  {
    if(size>0) {
      void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
      _array = array_new<C>(mem, _capacity);
    } else {
      _array=0;
    }
  }